

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_container_unit.c
# Opt level: O2

void mini_fuzz_recycle_array_container_intersection_inplace(void)

{
  uint16_t uVar1;
  _Bool _Var2;
  uint uVar3;
  uint16_t *buffer;
  uint16_t *buffer_00;
  uint16_t *buffer_01;
  array_container_t *arr;
  array_container_t *arr_00;
  array_container_t *arr_01;
  bitset_container_t *bitset;
  bitset_container_t *bitset_00;
  bitset_container_t *bitset_01;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  
  splitmix64_x = 0x3039;
  buffer = (uint16_t *)malloc(0x2000);
  buffer_00 = (uint16_t *)malloc(0x2000);
  buffer_01 = (uint16_t *)malloc(0x2000);
  arr = array_container_create();
  arr_00 = array_container_create();
  arr_01 = array_container_create();
  bitset = bitset_container_create();
  bitset_00 = bitset_container_create();
  bitset_01 = bitset_container_create();
  for (lVar7 = 0; lVar7 != 3000; lVar7 = lVar7 + 1) {
    bitset_container_clear(bitset);
    bitset_container_clear(bitset_00);
    bitset_container_clear(bitset_01);
    arr->cardinality = 0;
    arr_00->cardinality = 0;
    arr_01->cardinality = 0;
    sVar4 = populate(buffer,0x1000);
    sVar5 = populate(buffer_00,0x1000);
    sVar6 = populate(buffer_01,0x1000);
    for (uVar3 = 0; uVar3 < sVar4; uVar3 = uVar3 + 1) {
      uVar1 = buffer[uVar3];
      array_container_add(arr,uVar1);
      bitset_container_set(bitset,uVar1);
    }
    for (uVar3 = 0; uVar3 < sVar5; uVar3 = uVar3 + 1) {
      uVar1 = buffer_00[uVar3];
      array_container_add(arr_00,uVar1);
      bitset_container_set(bitset_00,uVar1);
    }
    for (uVar3 = 0; uVar3 < sVar6; uVar3 = uVar3 + 1) {
      uVar1 = buffer_01[uVar3];
      array_container_add(arr_01,uVar1);
      bitset_container_set(bitset_01,uVar1);
    }
    bitset->cardinality = -1;
    array_container_intersection_inplace(arr,arr_00);
    bitset_container_and_nocard(bitset,bitset_00,bitset);
    _Var2 = array_container_equal_bitset(arr,bitset);
    _assert_true((ulong)_Var2,"array_container_equal_bitset(array1, bitset1)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x14e);
    array_container_intersection_inplace(arr,arr_01);
    bitset_container_and_nocard(bitset,bitset_01,bitset);
    _Var2 = array_container_equal_bitset(arr,bitset);
    _assert_true((ulong)_Var2,"array_container_equal_bitset(array1, bitset1)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x152);
    for (uVar3 = 0; uVar3 < sVar4; uVar3 = uVar3 + 1) {
      uVar1 = buffer[uVar3];
      array_container_add(arr,uVar1);
      bitset_container_set(bitset,uVar1);
    }
    bitset->cardinality = -1;
    _Var2 = array_container_equal_bitset(arr,bitset);
    _assert_true((ulong)_Var2,"array_container_equal_bitset(array1, bitset1)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x159);
    array_container_intersection_inplace(arr,arr_00);
    bitset_container_and_nocard(bitset,bitset_00,bitset);
    _Var2 = array_container_equal_bitset(arr,bitset);
    _assert_true((ulong)_Var2,"array_container_equal_bitset(array1, bitset1)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x15d);
    array_container_intersection_inplace(arr,arr_01);
    bitset_container_and_nocard(bitset,bitset_01,bitset);
    _Var2 = array_container_equal_bitset(arr,bitset);
    _assert_true((ulong)_Var2,"array_container_equal_bitset(array1, bitset1)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x161);
  }
  array_container_free(arr);
  array_container_free(arr_00);
  array_container_free(arr_01);
  bitset_container_free(bitset);
  bitset_container_free(bitset_00);
  bitset_container_free(bitset_01);
  free(buffer);
  free(buffer_00);
  free(buffer_01);
  return;
}

Assistant:

static inline void splitmix64_seed(uint64_t seed) { splitmix64_x = seed; }